

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O0

any_lite * __thiscall nonstd::any_lite::any_cast<std::__cxx11::string>(any_lite *this,any *operand)

{
  bad_any_cast *this_00;
  bad_any_cast local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result;
  any *operand_local;
  
  result = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operand;
  operand_local = (any *)this;
  local_20 = any_cast<std::__cxx11::string>(operand);
  if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    this_00 = (bad_any_cast *)__cxa_allocate_exception(8);
    local_28 = (bad_any_cast)0x0;
    bad_any_cast::bad_any_cast(&local_28);
    bad_any_cast::bad_any_cast(this_00,&local_28);
    __cxa_throw(this_00,&bad_any_cast::typeinfo,bad_any_cast::~bad_any_cast);
  }
  std::__cxx11::string::string((string *)this,(string *)local_20);
  return this;
}

Assistant:

any_nodiscard inline ValueType any_cast( any & operand )
{
   const ValueType * result = any_cast< typename std11::remove_reference<ValueType>::type >( &operand );

#if any_CONFIG_NO_EXCEPTIONS
   assert( result );
#else
   if ( ! result )
   {
       throw bad_any_cast();
   }
#endif

   return *result;
}